

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O0

bool flow::transform::eliminateLinearBr(IRHandler *handler)

{
  bool bVar1;
  TerminateInstr *pTVar2;
  BasicBlock *pBVar3;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *pvVar4;
  size_type sVar5;
  reference ppBVar6;
  BasicBlock *local_70;
  undefined1 local_60 [16];
  BasicBlock *nextBB;
  BrInstr *br;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  IRHandler *handler_local;
  
  ___begin2 = IRHandler::basicBlocks_abi_cxx11_(handler);
  __end2 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                    *)&__begin2);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
              *)&__begin2);
  while( true ) {
    bVar1 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end2,(iterator *)&bb);
    if (!bVar1) {
      return false;
    }
    br = (BrInstr *)
         util::
         UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
         ::iterator::operator*(&__end2);
    pTVar2 = BasicBlock::getTerminator((BasicBlock *)br);
    if (pTVar2 == (TerminateInstr *)0x0) {
      local_70 = (BasicBlock *)0x0;
    }
    else {
      local_70 = (BasicBlock *)__dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0)
      ;
    }
    nextBB = local_70;
    if (local_70 != (BasicBlock *)0x0) break;
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end2);
  }
  pBVar3 = BrInstr::targetBlock((BrInstr *)local_70);
  pvVar4 = BasicBlock::predecessors(pBVar3);
  sVar5 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::size(pvVar4);
  if (sVar5 != 1) {
    return false;
  }
  pBVar3 = BrInstr::targetBlock((BrInstr *)nextBB);
  pvVar4 = BasicBlock::predecessors(pBVar3);
  ppBVar6 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::front(pvVar4);
  if (*ppBVar6 != (value_type)br) {
    return false;
  }
  local_60._8_8_ = BrInstr::targetBlock((BrInstr *)nextBB);
  BasicBlock::remove((BasicBlock *)local_60,(char *)br);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr
            ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_60);
  BasicBlock::merge_back((BasicBlock *)br,(BasicBlock *)local_60._8_8_);
  return true;
}

Assistant:

bool eliminateLinearBr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless linear br
    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      if (br->targetBlock()->predecessors().size() != 1)
        return false;

      if (br->targetBlock()->predecessors().front() != bb)
        return false;

      // we are the only predecessor of BR's target block, so merge them
      BasicBlock* nextBB = br->targetBlock();

      // FLOW_TRACE("flow: eliminate linear BR-instruction from {} to {}", bb->name(), nextBB->name());

      // remove old terminator
      bb->remove(br);

      // merge nextBB
      bb->merge_back(nextBB);

      // destroy unused BB
      //bb->getHandler()->erase(nextBB);

      return true;
    }
  }

  return false;
}